

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestConfigureHandler.cxx
# Opt level: O2

int __thiscall cmCTestConfigureHandler::ProcessHandler(cmCTestConfigureHandler *this)

{
  cmCTest *pcVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  double dVar5;
  double dVar6;
  allocator local_70d;
  int retVal;
  string local_708;
  uint start_time_time;
  cmXMLWriter xml;
  string cCommand;
  string output;
  string buildDirectory;
  ostringstream cmCTestLog_msg_5;
  string start_time;
  ostringstream cmCTestLog_msg;
  byte abStack_490 [552];
  cmGeneratedFileStream ofs;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,"Configure project");
  std::endl<char,std::char_traits<char>>(poVar4);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
               ,0x27,(char *)ofs.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                             _vptr_basic_ostream,(this->super_cmCTestGenericHandler).Quiet);
  std::__cxx11::string::~string((string *)&ofs);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string((string *)&cmCTestLog_msg,"ConfigureCommand",(allocator *)&ofs);
  cmCTest::GetCTestConfiguration(&cCommand,pcVar1,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  if (cCommand._M_string_length == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,
                             "Cannot find ConfigureCommand key in the DartConfiguration.tcl");
    std::endl<char,std::char_traits<char>>(poVar4);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                 ,0x2e,(char *)ofs.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>
                               ._vptr_basic_ostream,false);
    std::__cxx11::string::~string((string *)&ofs);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    iVar3 = -1;
    goto LAB_002bf3c5;
  }
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string((string *)&cmCTestLog_msg,"BuildDirectory",(allocator *)&ofs);
  cmCTest::GetCTestConfiguration(&buildDirectory,pcVar1,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  if (buildDirectory._M_string_length == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,
                             "Cannot find BuildDirectory  key in the DartConfiguration.tcl");
    std::endl<char,std::char_traits<char>>(poVar4);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                 ,0x38,(char *)ofs.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>
                               ._vptr_basic_ostream,false);
    std::__cxx11::string::~string((string *)&ofs);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    iVar3 = -1;
  }
  else {
    dVar5 = cmsys::SystemTools::GetTime();
    output._M_dataplus._M_p = (pointer)&output.field_2;
    output._M_string_length = 0;
    output.field_2._M_local_buf[0] = '\0';
    retVal = 0;
    bVar2 = cmCTest::GetShowOnly((this->super_cmCTestGenericHandler).CTest);
    if (bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,"Configure with command: ");
      poVar4 = std::operator<<(poVar4,(string *)&cCommand);
      std::endl<char,std::char_traits<char>>(poVar4);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      iVar3 = 0;
      cmCTest::Log(pcVar1,0,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                   ,0x71,(char *)ofs.super_ofstream.
                                 super_basic_ostream<char,_std::char_traits<char>_>.
                                 _vptr_basic_ostream,(this->super_cmCTestGenericHandler).Quiet);
      std::__cxx11::string::~string((string *)&ofs);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
LAB_002bf316:
      if ((iVar3 == 0) || (iVar3 = 0, retVal != 0)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,"Error(s) when configuring the project")
        ;
        std::endl<char,std::char_traits<char>>(poVar4);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                     ,0x76,(char *)ofs.super_ofstream.
                                   super_basic_ostream<char,_std::char_traits<char>_>.
                                   _vptr_basic_ostream,false);
        std::__cxx11::string::~string((string *)&ofs);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        iVar3 = -1;
      }
    }
    else {
      cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)&cmCTestLog_msg);
      bVar2 = cmCTestGenericHandler::StartResultingXML
                        (&this->super_cmCTestGenericHandler,PartConfigure,"Configure",
                         (cmGeneratedFileStream *)&cmCTestLog_msg);
      if (bVar2) {
        cmCTest::CurrentTime_abi_cxx11_(&start_time,(this->super_cmCTestGenericHandler).CTest);
        dVar6 = cmsys::SystemTools::GetTime();
        start_time_time = (uint)(long)dVar6;
        cmGeneratedFileStream::cmGeneratedFileStream(&ofs);
        cmCTestGenericHandler::StartLogFile(&this->super_cmCTestGenericHandler,"Configure",&ofs);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_5);
        poVar4 = std::operator<<((ostream *)&cmCTestLog_msg_5,"Configure with command: ");
        poVar4 = std::operator<<(poVar4,(string *)&cCommand);
        std::endl<char,std::char_traits<char>>(poVar4);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                     ,0x50,(char *)xml.Output,(this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)&xml);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_5);
        iVar3 = cmCTest::RunMakeCommand
                          ((this->super_cmCTestGenericHandler).CTest,cCommand._M_dataplus._M_p,
                           &output,&retVal,buildDirectory._M_dataplus._M_p,0,(ostream *)&ofs);
        if (((&ofs.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
             [(long)ofs.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream[-3]] & 5) == 0) {
          std::ofstream::close();
        }
        if ((abStack_490[*(long *)(_cmCTestLog_msg + -0x18)] & 5) == 0) {
          cmXMLWriter::cmXMLWriter(&xml,(ostream *)&cmCTestLog_msg,0);
          cmCTest::StartXML((this->super_cmCTestGenericHandler).CTest,&xml,
                            (this->super_cmCTestGenericHandler).AppendXML);
          std::__cxx11::string::string
                    ((string *)&cmCTestLog_msg_5,"Configure",(allocator *)&local_708);
          cmXMLWriter::StartElement(&xml,(string *)&cmCTestLog_msg_5);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg_5);
          std::__cxx11::string::string
                    ((string *)&cmCTestLog_msg_5,"StartDateTime",(allocator *)&local_708);
          cmXMLWriter::Element<std::__cxx11::string>(&xml,(string *)&cmCTestLog_msg_5,&start_time);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg_5);
          std::__cxx11::string::string
                    ((string *)&cmCTestLog_msg_5,"StartConfigureTime",(allocator *)&local_708);
          cmXMLWriter::Element<unsigned_int>(&xml,(string *)&cmCTestLog_msg_5,&start_time_time);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg_5);
          std::__cxx11::string::string
                    ((string *)&cmCTestLog_msg_5,"ConfigureCommand",(allocator *)&local_708);
          cmXMLWriter::Element<std::__cxx11::string>(&xml,(string *)&cmCTestLog_msg_5,&cCommand);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg_5);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_5);
          poVar4 = std::operator<<((ostream *)&cmCTestLog_msg_5,"End");
          std::endl<char,std::char_traits<char>>(poVar4);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                       ,0x62,local_708._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
          std::__cxx11::string::~string((string *)&local_708);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_5);
          std::__cxx11::string::string((string *)&cmCTestLog_msg_5,"Log",(allocator *)&local_708);
          cmXMLWriter::Element<std::__cxx11::string>(&xml,(string *)&cmCTestLog_msg_5,&output);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg_5);
          std::__cxx11::string::string
                    ((string *)&cmCTestLog_msg_5,"ConfigureStatus",(allocator *)&local_708);
          cmXMLWriter::Element<int>(&xml,(string *)&cmCTestLog_msg_5,&retVal);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg_5);
          std::__cxx11::string::string((string *)&cmCTestLog_msg_5,"EndDateTime",&local_70d);
          cmCTest::CurrentTime_abi_cxx11_(&local_708,(this->super_cmCTestGenericHandler).CTest);
          cmXMLWriter::Element<std::__cxx11::string>(&xml,(string *)&cmCTestLog_msg_5,&local_708);
          std::__cxx11::string::~string((string *)&local_708);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg_5);
          std::__cxx11::string::string((string *)&cmCTestLog_msg_5,"EndConfigureTime",&local_70d);
          dVar6 = cmsys::SystemTools::GetTime();
          local_708._M_dataplus._M_p._0_4_ = (int)(long)dVar6;
          cmXMLWriter::Element<unsigned_int>(&xml,(string *)&cmCTestLog_msg_5,(uint *)&local_708);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg_5);
          std::__cxx11::string::string((string *)&cmCTestLog_msg_5,"ElapsedMinutes",&local_70d);
          dVar6 = cmsys::SystemTools::GetTime();
          local_708._M_dataplus._M_p = (pointer)((double)(int)((dVar6 - dVar5) / 6.0) / 10.0);
          cmXMLWriter::Element<double>(&xml,(string *)&cmCTestLog_msg_5,(double *)&local_708);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg_5);
          cmXMLWriter::EndElement(&xml);
          cmCTest::EndXML((this->super_cmCTestGenericHandler).CTest,&xml);
          cmXMLWriter::~cmXMLWriter(&xml);
        }
        cmGeneratedFileStream::~cmGeneratedFileStream(&ofs);
        std::__cxx11::string::~string((string *)&start_time);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ofs);
        poVar4 = std::operator<<((ostream *)&ofs,"Cannot open configure file");
        std::endl<char,std::char_traits<char>>(poVar4);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        iVar3 = 0;
        cmCTest::Log(pcVar1,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                     ,0x46,_cmCTestLog_msg_5,false);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_5);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ofs);
      }
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&cmCTestLog_msg);
      if (bVar2) goto LAB_002bf316;
      iVar3 = 1;
    }
    std::__cxx11::string::~string((string *)&output);
  }
  std::__cxx11::string::~string((string *)&buildDirectory);
LAB_002bf3c5:
  std::__cxx11::string::~string((string *)&cCommand);
  return iVar3;
}

Assistant:

int cmCTestConfigureHandler::ProcessHandler()
{
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
    "Configure project" << std::endl, this->Quiet);
  std::string cCommand
    = this->CTest->GetCTestConfiguration("ConfigureCommand");
  if (cCommand.empty())
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
      "Cannot find ConfigureCommand key in the DartConfiguration.tcl"
      << std::endl);
    return -1;
    }

  std::string buildDirectory
    = this->CTest->GetCTestConfiguration("BuildDirectory");
  if (buildDirectory.empty())
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
      "Cannot find BuildDirectory  key in the DartConfiguration.tcl"
      << std::endl);
    return -1;
    }

  double elapsed_time_start = cmSystemTools::GetTime();
  std::string output;
  int retVal = 0;
  int res = 0;
  if ( !this->CTest->GetShowOnly() )
    {
    cmGeneratedFileStream os;
    if(!this->StartResultingXML(cmCTest::PartConfigure, "Configure", os))
      {
      cmCTestLog(this->CTest, ERROR_MESSAGE, "Cannot open configure file"
        << std::endl);
      return 1;
      }
    std::string start_time = this->CTest->CurrentTime();
    unsigned int start_time_time = static_cast<unsigned int>(
      cmSystemTools::GetTime());

    cmGeneratedFileStream ofs;
    this->StartLogFile("Configure", ofs);
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
      "Configure with command: " << cCommand << std::endl, this->Quiet);
    res = this->CTest->RunMakeCommand(cCommand.c_str(), output,
      &retVal, buildDirectory.c_str(),
      0, ofs);

    if ( ofs )
      {
      ofs.close();
      }

    if ( os )
      {
      cmXMLWriter xml(os);
      this->CTest->StartXML(xml, this->AppendXML);
      xml.StartElement("Configure");
      xml.Element("StartDateTime", start_time);
      xml.Element("StartConfigureTime", start_time_time);
      xml.Element("ConfigureCommand", cCommand);
      cmCTestOptionalLog(this->CTest, DEBUG, "End" << std::endl, this->Quiet);
      xml.Element("Log", output);
      xml.Element("ConfigureStatus", retVal);
      xml.Element("EndDateTime", this->CTest->CurrentTime());
      xml.Element("EndConfigureTime",
        static_cast<unsigned int>(cmSystemTools::GetTime()));
      xml.Element("ElapsedMinutes", static_cast<int>(
        (cmSystemTools::GetTime() - elapsed_time_start)/6)/10.0);
      xml.EndElement(); // Configure
      this->CTest->EndXML(xml);
      }
    }
  else
    {
    cmCTestOptionalLog(this->CTest, DEBUG,
      "Configure with command: " << cCommand << std::endl, this->Quiet);
    }
  if (! res || retVal )
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
      "Error(s) when configuring the project" << std::endl);
    return -1;
    }
  return 0;
}